

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

int Gia_ObjRecognizeMuxLits(Gia_Man_t *p,Gia_Obj_t *pNode,int *iLitT,int *iLitE)

{
  int iVar1;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pCtrl;
  Gia_Obj_t *pNodeE;
  Gia_Obj_t *pNodeT;
  int *iLitE_local;
  int *iLitT_local;
  Gia_Obj_t *pNode_local;
  Gia_Man_t *p_local;
  
  pNodeT = (Gia_Obj_t *)iLitE;
  iLitE_local = iLitT;
  iLitT_local = (int *)pNode;
  pNode_local = (Gia_Obj_t *)p;
  pObj = Gia_ObjRecognizeMux(pNode,&pNodeE,&pCtrl);
  if (pObj != (Gia_Obj_t *)0x0) {
    iVar1 = Gia_Obj2Lit((Gia_Man_t *)pNode_local,pNodeE);
    *iLitE_local = iVar1;
    iVar1 = Gia_Obj2Lit((Gia_Man_t *)pNode_local,pCtrl);
    *(int *)pNodeT = iVar1;
    iVar1 = Gia_Obj2Lit((Gia_Man_t *)pNode_local,pObj);
    return iVar1;
  }
  __assert_fail("pCtrl != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                ,0x421,"int Gia_ObjRecognizeMuxLits(Gia_Man_t *, Gia_Obj_t *, int *, int *)");
}

Assistant:

int Gia_ObjRecognizeMuxLits( Gia_Man_t * p, Gia_Obj_t * pNode, int * iLitT, int * iLitE )
{
    Gia_Obj_t * pNodeT, * pNodeE;
    Gia_Obj_t * pCtrl = Gia_ObjRecognizeMux( pNode, &pNodeT, &pNodeE );
    assert( pCtrl != NULL );
    *iLitT = Gia_Obj2Lit( p, pNodeT );
    *iLitE = Gia_Obj2Lit( p, pNodeE );
    return Gia_Obj2Lit( p, pCtrl );
}